

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null_mechanism.cpp
# Opt level: O3

int __thiscall zmq::null_mechanism_t::process_handshake_command(null_mechanism_t *this,msg_t *msg_)

{
  int iVar1;
  EVP_PKEY_CTX *ctx;
  size_t data_size_;
  socket_base_t *this_00;
  endpoint_uri_pair_t *endpoint_uri_pair_;
  int *piVar2;
  
  if (((this->super_zap_client_t).field_0x4a == '\0') &&
     ((this->super_zap_client_t).field_0x4b != '\x01')) {
    ctx = (EVP_PKEY_CTX *)msg_t::data(msg_);
    data_size_ = msg_t::size(msg_);
    if (5 < data_size_) {
      if (*(short *)(ctx + 4) == 0x5944 && *(int *)ctx == 0x41455205) {
        (this->super_zap_client_t).field_0x4a = 1;
        ctx = ctx + 6;
        iVar1 = mechanism_t::parse_metadata
                          ((mechanism_t *)&(this->super_zap_client_t).field_0x50,(uchar *)ctx,
                           data_size_ - 6,false);
      }
      else {
        if (*(short *)(ctx + 4) != 0x524f || *(int *)ctx != 0x52524505) goto LAB_001a1dd9;
        iVar1 = process_error_command(this,(uchar *)ctx,data_size_);
      }
      if (iVar1 != 0) {
        return iVar1;
      }
      iVar1 = msg_t::close(msg_,(int)ctx);
      if (iVar1 != 0) {
        process_handshake_command();
      }
      iVar1 = msg_t::init(msg_,ctx);
      if (iVar1 == 0) {
        return 0;
      }
      process_handshake_command();
      return iVar1;
    }
  }
LAB_001a1dd9:
  this_00 = session_base_t::get_socket(*(session_base_t **)&this->field_0x5e0);
  endpoint_uri_pair_ = session_base_t::get_endpoint(*(session_base_t **)&this->field_0x5e0);
  socket_base_t::event_handshake_failed_protocol(this_00,endpoint_uri_pair_,0x10000001);
  piVar2 = __errno_location();
  *piVar2 = 0x47;
  return -1;
}

Assistant:

int zmq::null_mechanism_t::process_handshake_command (msg_t *msg_)
{
    if (_ready_command_received || _error_command_received) {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        return -1;
    }

    const unsigned char *cmd_data =
      static_cast<unsigned char *> (msg_->data ());
    const size_t data_size = msg_->size ();

    int rc = 0;
    if (data_size >= ready_command_name_len
        && !memcmp (cmd_data, ready_command_name, ready_command_name_len))
        rc = process_ready_command (cmd_data, data_size);
    else if (data_size >= error_command_name_len
             && !memcmp (cmd_data, error_command_name, error_command_name_len))
        rc = process_error_command (cmd_data, data_size);
    else {
        session->get_socket ()->event_handshake_failed_protocol (
          session->get_endpoint (), ZMQ_PROTOCOL_ERROR_ZMTP_UNEXPECTED_COMMAND);
        errno = EPROTO;
        rc = -1;
    }

    if (rc == 0) {
        rc = msg_->close ();
        errno_assert (rc == 0);
        rc = msg_->init ();
        errno_assert (rc == 0);
    }
    return rc;
}